

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

char * zlib_mem_inflate(char *cdata,size_t csize,size_t *size)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  char *__ptr;
  char *pcVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char *local_a0;
  uint local_98;
  undefined8 local_90;
  char *local_88;
  int local_80;
  size_t local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  
  auVar6._8_4_ = (int)(csize >> 0x20);
  auVar6._0_8_ = csize;
  auVar6._12_4_ = 0x45300000;
  iVar5 = (int)(((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(uint)csize) - 4503599627370496.0)) * 1.2 + 100.0);
  __ptr = (char *)malloc((long)iVar5);
  if (__ptr != (char *)0x0) {
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    local_90 = 0;
    local_78 = 0;
    local_a0 = cdata;
    local_98 = (uint)csize;
    local_88 = __ptr;
    local_80 = iVar5;
    iVar3 = inflateInit2_(&local_a0,0x2f,"1.2.11",0x70);
    sVar1 = local_78;
    uVar2 = local_98;
    if (iVar3 == 0) {
      do {
        if (uVar2 == 0) {
LAB_001272b4:
          inflateEnd(&local_a0);
          *size = local_78;
          return __ptr;
        }
        local_88 = __ptr + sVar1;
        iVar3 = inflate(&local_a0,0);
        sVar1 = local_78;
        uVar2 = local_98;
        if (iVar3 != 0) {
          if (iVar3 != 1) {
            zlib_mem_inflate_cold_2();
          }
          goto LAB_001272b4;
        }
        auVar7._8_4_ = (int)((ulong)local_90 >> 0x20);
        auVar7._0_8_ = local_90;
        auVar7._12_4_ = 0x45300000;
        auVar8._8_4_ = (int)(local_78 >> 0x20);
        auVar8._0_8_ = local_78;
        auVar8._12_4_ = 0x45300000;
        iVar3 = (int)(((auVar8._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0)) *
                      ((double)local_98 /
                      ((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_90) - 4503599627370496.0))) + 100.0);
        iVar5 = iVar5 + iVar3;
        pcVar4 = (char *)realloc(__ptr,(long)iVar5);
        if (pcVar4 == (char *)0x0) {
          free(__ptr);
          return (char *)0x0;
        }
        local_80 = local_80 + iVar3;
        __ptr = pcVar4;
      } while( true );
    }
    zlib_mem_inflate_cold_1();
  }
  return (char *)0x0;
}

Assistant:

char *zlib_mem_inflate(char *cdata, size_t csize, size_t *size) {
    z_stream s;
    unsigned char *data = NULL; /* Uncompressed output */
    int data_alloc = 0;
    int err;

    /* Starting point at uncompressed size, and scale after that */
    data = malloc(data_alloc = csize*1.2+100);
    if (!data)
	return NULL;

    /* Initialise zlib stream */
    s.zalloc = Z_NULL; /* use default allocation functions */
    s.zfree  = Z_NULL;
    s.opaque = Z_NULL;
    s.next_in  = (unsigned char *)cdata;
    s.avail_in = csize;
    s.total_in = 0;
    s.next_out  = data;
    s.avail_out = data_alloc;
    s.total_out = 0;

    //err = inflateInit(&s);
    err = inflateInit2(&s, 15 + 32);
    if (err != Z_OK) {
	fprintf(stderr, "zlib inflateInit error: %s\n", s.msg);
	free(data);
	return NULL;
    }

    /* Decode to 'data' array */
    for (;s.avail_in;) {
	unsigned char *data_tmp;
	int alloc_inc;

	s.next_out = &data[s.total_out];
	err = inflate(&s, Z_NO_FLUSH);
	if (err == Z_STREAM_END)
	    break;

	if (err != Z_OK) {
	    fprintf(stderr, "zlib inflate error: %s\n", s.msg);
	    break;
	}

	/* More to come, so realloc based on growth so far */
	alloc_inc = (double)s.avail_in/s.total_in * s.total_out + 100;
	data = realloc((data_tmp = data), data_alloc += alloc_inc);
	if (!data) {
	    free(data_tmp);
	    return NULL;
	}
	s.avail_out += alloc_inc;
    }
    inflateEnd(&s);

    *size = s.total_out;
    return (char *)data;
}